

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O2

void __thiscall spdlog::details::c_formatter::format(c_formatter *this,log_msg *msg,tm *tm_time)

{
  MemoryWriter *w;
  BasicWriter<char> *pBVar1;
  
  w = &msg->formatted;
  pBVar1 = fmt::BasicWriter<char>::operator<<
                     (&w->super_BasicWriter<char>,
                      *(BasicStringRef<char> *)(days_abi_cxx11_ + (long)tm_time->tm_wday * 0x20));
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,' ');
  pBVar1 = fmt::BasicWriter<char>::operator<<
                     (pBVar1,*(BasicStringRef<char> *)
                              (months_abi_cxx11_ + (long)tm_time->tm_mon * 0x20));
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,' ');
  fmt::BasicWriter<char>::write_decimal<int>(pBVar1,tm_time->tm_mday);
  fmt::BasicWriter<char>::operator<<(pBVar1,' ');
  pad_n_join(w,tm_time->tm_hour,tm_time->tm_min,tm_time->tm_sec,':');
  pBVar1 = fmt::BasicWriter<char>::operator<<(&w->super_BasicWriter<char>,' ');
  fmt::BasicWriter<char>::write_decimal<int>(pBVar1,tm_time->tm_year + 0x76c);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
        msg.formatted << days[tm_time.tm_wday] << ' ' << months[tm_time.tm_mon] << ' ' << tm_time.tm_mday << ' ';
        pad_n_join(msg.formatted, tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec, ':') << ' ' << tm_time.tm_year + 1900;
    }